

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SystemIdentifier::SystemIdentifier
          (SystemIdentifier *this,SystemType T,SystemName N,SystemMode M,KBOOL ChangeIndicator,
          KBOOL AltMode4,KBOOL AltModeC)

{
  KBOOL AltModeC_local;
  KBOOL AltMode4_local;
  KBOOL ChangeIndicator_local;
  SystemMode M_local;
  SystemName N_local;
  SystemType T_local;
  SystemIdentifier *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SystemIdentifier_0032f6a8;
  this->m_ui16SystemType = (KUINT16)T;
  this->m_ui16SystemName = (KUINT16)N;
  this->m_ui8SystemMode = (KUINT8)M;
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xfe | ChangeIndicator;
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xfd | AltMode4 << 1;
  (this->field_3).m_ui8ChangeOptions = (this->field_3).m_ui8ChangeOptions & 0xfb | AltModeC << 2;
  return;
}

Assistant:

SystemIdentifier::SystemIdentifier( SystemType T, SystemName N, SystemMode M, KBOOL ChangeIndicator,
                                    KBOOL AltMode4 /* = false */, KBOOL AltModeC /* = false */ ) :
    m_ui16SystemType( T ),
    m_ui16SystemName( N ),
    m_ui8SystemMode( M ),
    m_ui8ChangeIndicator( ChangeIndicator ),
    m_ui8AltMode4( AltMode4 ),
    m_ui8AltModeC( AltModeC )
{
}